

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O2

void apriltag_detector_remove_family(apriltag_detector_t *td,apriltag_family_t *fam)

{
  zarray_t *za;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  apriltag_family_t *local_28;
  
  local_28 = fam;
  quick_decode_uninit(fam);
  za = td->tag_families;
  if (za == (zarray_t *)0x0) {
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                  ,0x127,"int zarray_remove_value(zarray_t *, const void *, int)");
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)za->size;
  if (za->size < 1) {
    uVar2 = uVar3;
  }
  while( true ) {
    if (uVar2 == uVar3) {
      return;
    }
    iVar1 = bcmp(&local_28,za->data + za->el_sz * uVar3,za->el_sz);
    if (iVar1 == 0) break;
    uVar3 = uVar3 + 1;
  }
  zarray_remove_index(za,(int)uVar3,0);
  return;
}

Assistant:

void apriltag_detector_remove_family(apriltag_detector_t *td, apriltag_family_t *fam)
{
    quick_decode_uninit(fam);
    zarray_remove_value(td->tag_families, &fam, 0);
}